

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

optional<pbrt::LightLiSample> * __thiscall
pbrt::ProjectionLight::SampleLi
          (optional<pbrt::LightLiSample> *__return_storage_ptr__,ProjectionLight *this,
          LightSampleContext ctx,Point2f u,SampledWavelengths lambda,LightSamplingMode mode)

{
  undefined8 uVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar8 [64];
  undefined1 auVar10 [64];
  undefined1 auVar12 [64];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [56];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  float fVar27;
  Vector3f wl;
  SampledSpectrum SVar28;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  undefined1 auVar9 [64];
  undefined1 auVar11 [64];
  undefined1 auVar13 [64];
  undefined1 auVar19 [56];
  undefined1 auVar22 [64];
  
  auVar16 = ZEXT816(0) << 0x40;
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[0][1] * 0.0)),
                           auVar16,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][0]))
  ;
  auVar7 = vfmadd231ss_fma(auVar7,auVar16,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][2]));
  fVar3 = auVar7._0_4_ + (this->super_LightBase).renderFromLight.m.m[0][3];
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[1][1] * 0.0)),
                           auVar16,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]))
  ;
  auVar7 = vfmadd231ss_fma(auVar7,auVar16,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]));
  fVar14 = auVar7._0_4_ + (this->super_LightBase).renderFromLight.m.m[1][3];
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[2][1] * 0.0)),
                           auVar16,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]))
  ;
  auVar7 = vfmadd231ss_fma(auVar7,auVar16,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][2]));
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[3][1] * 0.0))
                            ,auVar16,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][0]
                                            ));
  auVar15 = vfmadd231ss_fma(auVar15,auVar16,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][2]));
  fVar27 = auVar15._0_4_ + (this->super_LightBase).renderFromLight.m.m[3][3];
  bVar2 = fVar27 == 1.0;
  fVar4 = auVar7._0_4_ + (this->super_LightBase).renderFromLight.m.m[2][3];
  fVar26 = fVar3 / fVar27;
  fVar25 = fVar14 / fVar27;
  fVar27 = fVar4 / fVar27;
  auVar9._16_48_ = in_ZmmResult._16_48_;
  auVar9._0_16_ = ZEXT416((uint)fVar26);
  auVar8._4_60_ = auVar9._4_60_;
  auVar8._0_4_ = (uint)bVar2 * (int)fVar3 + (uint)!bVar2 * (int)fVar26;
  local_38 = auVar8._0_16_;
  auVar11._16_48_ = auVar9._16_48_;
  auVar11._0_16_ = ZEXT416((uint)fVar25);
  auVar10._4_60_ = auVar11._4_60_;
  auVar10._0_4_ = (uint)bVar2 * (int)fVar14 + (uint)!bVar2 * (int)fVar25;
  auVar13._16_48_ = auVar9._16_48_;
  auVar13._0_16_ = ZEXT416((uint)fVar27);
  auVar12._4_60_ = auVar13._4_60_;
  auVar12._0_4_ = (float)((uint)bVar2 * (int)fVar4 + (uint)!bVar2 * (int)fVar27);
  local_58 = auVar12._0_16_;
  local_48 = vinsertps_avx(local_38,auVar10._0_16_,0x10);
  auVar7 = vinsertps_avx(ctx.pi.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_,
                         ZEXT416((uint)ctx.pi.super_Point3<pbrt::Interval>.
                                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
  auVar15._0_4_ =
       ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high +
       auVar7._0_4_;
  auVar15._4_4_ =
       ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
       auVar7._4_4_;
  auVar15._8_4_ = auVar7._8_4_ + 0.0;
  auVar15._12_4_ = auVar7._12_4_ + 0.0;
  auVar7._8_4_ = 0xbf000000;
  auVar7._0_8_ = 0xbf000000bf000000;
  auVar7._12_4_ = 0xbf000000;
  auVar7 = vmulps_avx512vl(auVar15,auVar7);
  auVar24._0_4_ = local_48._0_4_ + auVar7._0_4_;
  auVar24._4_4_ = local_48._4_4_ + auVar7._4_4_;
  auVar24._8_4_ = local_48._8_4_ + auVar7._8_4_;
  auVar24._12_4_ = local_48._12_4_ + auVar7._12_4_;
  auVar16._0_4_ = auVar24._0_4_ * auVar24._0_4_;
  auVar16._4_4_ = auVar24._4_4_ * auVar24._4_4_;
  auVar16._8_4_ = auVar24._8_4_ * auVar24._8_4_;
  auVar16._12_4_ = auVar24._12_4_ * auVar24._12_4_;
  auVar7 = vhaddps_avx(auVar16,auVar16);
  fVar3 = auVar12._0_4_ +
          (ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
          ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) *
          -0.5;
  fVar14 = auVar7._0_4_ + fVar3 * fVar3;
  local_28 = ZEXT416((uint)fVar14);
  if (fVar14 < 0.0) {
    fVar14 = sqrtf(fVar14);
  }
  else {
    auVar7 = vsqrtss_avx(local_28,local_28);
    fVar14 = auVar7._0_4_;
  }
  auVar20._4_4_ = fVar14;
  auVar20._0_4_ = fVar14;
  auVar20._8_4_ = fVar14;
  auVar20._12_4_ = fVar14;
  auVar7 = vdivps_avx(auVar24,auVar20);
  auVar15 = vmovshdup_avx(auVar7);
  auVar24 = ZEXT416((uint)(fVar3 / fVar14));
  fVar27 = auVar15._0_4_;
  auVar15 = vfnmsub231ss_fma(ZEXT416((uint)(fVar27 * (this->super_LightBase).renderFromLight.mInv.m
                                                     [0][1])),auVar7,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][0]));
  auVar15 = vfnmadd231ss_fma(auVar15,auVar24,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][2]));
  auVar16 = vfnmsub231ss_fma(ZEXT416((uint)(fVar27 * (this->super_LightBase).renderFromLight.mInv.m
                                                     [1][1])),auVar7,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][0]));
  auVar16 = vfnmadd231ss_fma(auVar16,auVar24,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][2]));
  auVar15 = vinsertps_avx(auVar15,auVar16,0x10);
  auVar16 = vfnmsub231ss_fma(ZEXT416((uint)(fVar27 * (this->super_LightBase).renderFromLight.mInv.m
                                                     [2][1])),auVar7,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][0]));
  auVar16 = vfnmadd231ss_fma(auVar16,auVar24,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][2]));
  wl.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar15._0_8_;
  wl.super_Tuple3<pbrt::Vector3,_float>.z = auVar16._0_4_;
  auVar23 = ZEXT856(auVar16._8_8_);
  auVar19 = ZEXT856(auVar15._8_8_);
  SVar28 = I(this,wl,&lambda);
  auVar22._0_8_ = SVar28.values.values._8_8_;
  auVar22._8_56_ = auVar23;
  auVar18._0_8_ = SVar28.values.values._0_8_;
  auVar18._8_56_ = auVar19;
  auVar15 = vmovlhps_avx(auVar18._0_16_,auVar22._0_16_);
  auVar21._4_4_ = local_28._0_4_;
  auVar21._0_4_ = local_28._0_4_;
  auVar21._8_4_ = local_28._0_4_;
  auVar21._12_4_ = local_28._0_4_;
  auVar15 = vdivps_avx(auVar15,auVar21);
  local_68._0_4_ = auVar15._0_4_;
  if (((float)local_68 == 0.0) && (!NAN((float)local_68))) {
    uVar5 = 0;
    while (uVar6 = uVar5, uVar6 != 3) {
      fVar27 = *(float *)((long)&local_68 + uVar6 * 4 + 4);
      if ((fVar27 != 0.0) || (uVar5 = uVar6 + 1, NAN(fVar27))) break;
    }
    if (2 < uVar6) {
      *(undefined1 (*) [64])((long)&__return_storage_ptr__->optionalValue + 0x38) =
           ZEXT464(0) << 0x20;
      *(undefined1 (*) [64])&__return_storage_ptr__->optionalValue = ZEXT464(0) << 0x20;
      return __return_storage_ptr__;
    }
  }
  auVar17._4_4_ = local_58._0_4_;
  auVar17._0_4_ = local_58._0_4_;
  auVar17._8_4_ = local_58._0_4_;
  auVar17._12_4_ = local_58._0_4_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
  local_68 = auVar15._0_8_;
  uStack_60 = auVar15._8_8_;
  (__return_storage_ptr__->optionalValue).__align = local_68;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = uStack_60;
  __return_storage_ptr__->set = true;
  uVar1 = vmovlps_avx(auVar7);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar1;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = fVar3 / fVar14;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = 0x3f800000;
  auVar7 = vshufps_avx(local_38,local_48,0x50);
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x20) = auVar7;
  uVar1 = vmovlps_avx(auVar17);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = uVar1;
  *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x60) =
       &(this->super_LightBase).mediumInterface;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLiSample> ProjectionLight::SampleLi(LightSampleContext ctx, Point2f u,
                                                        SampledWavelengths lambda,
                                                        LightSamplingMode mode) const {
    // Return sample for incident radiance from _ProjectionLight_
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    Vector3f wi = Normalize(p - ctx.p());
    Vector3f wl = renderFromLight.ApplyInverse(-wi);
    SampledSpectrum Li = I(wl, lambda) / DistanceSquared(p, ctx.p());
    if (!Li)
        return {};
    return LightLiSample(Li, wi, 1, Interaction(p, &mediumInterface));
}